

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

void helicsDataBufferToRawString
               (HelicsDataBuffer data,char *outputString,int maxStringLen,int *actualLength)

{
  _Alloc_hider _Var1;
  DataType baseType;
  Message *pMVar2;
  string v;
  string local_68;
  data_view local_48;
  
  if (outputString == (char *)0x0 || maxStringLen < 1) {
LAB_001b1a5b:
    if (actualLength != (int *)0x0) {
      *actualLength = 0;
    }
  }
  else {
    if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
      pMVar2 = getMessageObj(data,(HelicsError *)0x0);
      if (pMVar2 == (Message *)0x0) goto LAB_001b1a5b;
      data = &pMVar2->data;
    }
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_48.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
    local_48.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
    local_48.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    baseType = helics::detail::detectType((byte *)local_48.dblock._M_str);
    helics::valueExtract(&local_48,baseType,&local_68);
    if (local_48.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    _Var1._M_p = local_68._M_dataplus._M_p;
    if ((int)local_68._M_string_length < maxStringLen) {
      maxStringLen = (int)local_68._M_string_length;
    }
    memcpy(outputString,local_68._M_dataplus._M_p,(long)maxStringLen);
    if (actualLength != (int *)0x0) {
      *actualLength = maxStringLen;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_p != &local_68.field_2) {
      operator_delete(_Var1._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void helicsDataBufferToRawString(HelicsDataBuffer data, char* outputString, int maxStringLen, int* actualLength)
{
    if ((outputString == nullptr) || (maxStringLen <= 0)) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        if (actualLength != nullptr) {
            *actualLength = 0;
        }
        return;
    }
    std::string v;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);

    auto length = (std::min)(static_cast<int>(v.size()), maxStringLen);
    // NOLINTNEXTLINE
    std::memcpy(outputString, v.data(), length);

    if (actualLength != nullptr) {
        *actualLength = length;
    }
}